

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_extend(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQInteger SVar2;
  SQArray *this;
  SQRESULT SVar3;
  HSQUIRRELVM in_RDI;
  SQObject *o;
  SQInteger i;
  SQInteger n;
  SQArray *arr;
  SQChar *in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  SQArray *a;
  SQRESULT local_8;
  
  pSVar1 = stack_get(in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
  if (((pSVar1->super_SQObject)._flags & 1) == 0) {
    stack_get(in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
    SVar2 = sq_gettop(in_RDI);
    this = (SQArray *)(SVar2 + -1);
    for (a = (SQArray *)0x0; (long)a < (long)this;
        a = (SQArray *)((long)&(a->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1))
    {
      in_stack_ffffffffffffffd0 =
           (HSQUIRRELVM)stack_get(in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
      if (*(int *)&(in_stack_ffffffffffffffd0->super_SQCollectable).super_SQRefCounted.
                   _vptr_SQRefCounted != 0x8000040) {
        SVar3 = sq_throwerror(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        return SVar3;
      }
      SQArray::Extend(this,a);
    }
    sq_pop(in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
    local_8 = 1;
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

static SQInteger array_extend(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQArray *arr = _array(stack_get(v, 1));
    SQInteger n = sq_gettop(v)-1;
    for (SQInteger i=0; i<n; ++i) {
        SQObject &o=stack_get(v,2+i);
        if (sq_type(o) != OT_ARRAY)
            return sq_throwerror(v, _SC("only arrays can be used to extend array"));
        arr->Extend(_array(o));
    }
    sq_pop(v,n);
    return 1;
}